

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

void __thiscall propset_token_source::insert_token(propset_token_source *this,CTcToken *tok)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  undefined4 uVar4;
  propset_tok *ppVar5;
  propset_tok **pppVar6;
  
  ppVar5 = (propset_tok *)CTcPrsMem::alloc(G_prsmem,0x30);
  uVar4 = *(undefined4 *)&tok->field_0x4;
  pcVar1 = tok->text_;
  sVar2 = tok->text_len_;
  uVar3 = tok->int_val_;
  (ppVar5->tok).typ_ = tok->typ_;
  *(undefined4 *)&(ppVar5->tok).field_0x4 = uVar4;
  (ppVar5->tok).text_ = pcVar1;
  (ppVar5->tok).text_len_ = sVar2;
  (ppVar5->tok).int_val_ = uVar3;
  (ppVar5->tok).field_0x20 = tok->field_0x20;
  ppVar5->nxt = (propset_tok *)0x0;
  pppVar6 = &this->last_tok->nxt;
  if (this->last_tok == (propset_tok *)0x0) {
    pppVar6 = &this->nxt_tok;
  }
  *pppVar6 = ppVar5;
  this->last_tok = ppVar5;
  return;
}

Assistant:

void propset_token_source::insert_token(const CTcToken *tok)
{
	/* create a new link entry and initialize it */
    propset_tok *cur = new (G_prsmem) propset_tok(tok);

	/* link it into our list */
    if (last_tok != 0)
        last_tok->nxt = cur;
    else
        nxt_tok = cur;
    last_tok = cur;
}